

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Float FVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  float fVar27;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dd;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Float sinTheta;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  SampledSpectrum SVar43;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  
  local_b8.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._8_56_ = wi._8_56_;
  auVar26._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._4_60_ = wo._12_60_;
  auVar20._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._8_56_ = wo._8_56_;
  auVar19._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  _local_78 = auVar19._0_16_;
  local_a8._0_8_ = vmovlps_avx(_local_78);
  _local_38 = auVar26._0_16_;
  local_b8._0_8_ = vmovlps_avx(_local_38);
  _local_88 = ZEXT812(0);
  fStack_7c = 0.0;
  fVar41 = (this->mfDistrib).alpha_x;
  fVar10 = (this->mfDistrib).alpha_y;
  auVar23 = vminss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar41));
  if (auVar23._0_4_ < 0.001) goto LAB_0044ff06;
  fVar28 = auVar20._0_4_ * local_b8.z;
  local_98._4_4_ = in_XMM3_Db;
  local_98._0_4_ = local_b8.z;
  local_98._8_4_ = 0;
  local_98._12_4_ = in_XMM3_Dd;
  this_00 = &this->mfDistrib;
  auVar23 = auVar20._0_16_;
  local_a8.z = auVar20._0_4_;
  if (fVar28 <= 0.0) {
    if (((auVar20._0_4_ == 0.0) && (!NAN(auVar20._0_4_))) ||
       ((local_b8.z == 0.0 && (!NAN(local_b8.z))))) goto LAB_0044ff06;
    local_48 = ZEXT416((uint)this->eta);
    local_58 = auVar23;
    if ((f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
       (iVar9 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                     ::reg), iVar9 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg);
    }
    uVar2 = vcmpss_avx512f(local_58,ZEXT416(0),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    *(long *)(in_FS_OFFSET + -0x1e8) = *(long *)(in_FS_OFFSET + -0x1e8) + 1;
    fVar10 = (float)((uint)bVar3 * local_48._0_4_ +
                    (uint)!bVar3 * (int)(1.0 / (float)local_48._0_4_));
    auVar15._0_4_ = fVar10 * (float)local_38._0_4_ + (float)local_78._0_4_;
    auVar15._4_4_ = fVar10 * (float)local_38._4_4_ + (float)local_78._4_4_;
    auVar15._8_4_ = fVar10 * fStack_30 + fStack_70;
    auVar15._12_4_ = fVar10 * fStack_2c + fStack_6c;
    fVar41 = fVar10 * (float)local_98._0_4_ + local_58._0_4_;
    auVar23._0_4_ = auVar15._0_4_ * auVar15._0_4_;
    auVar23._4_4_ = auVar15._4_4_ * auVar15._4_4_;
    auVar23._8_4_ = auVar15._8_4_ * auVar15._8_4_;
    auVar23._12_4_ = auVar15._12_4_ * auVar15._12_4_;
    auVar23 = vmovshdup_avx(auVar23);
    auVar24 = ZEXT416(0) << 0x20;
    auVar23 = vfmadd231ss_fma(auVar23,auVar15,auVar15);
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
    if ((auVar23._0_4_ == 0.0) && (!NAN(auVar23._0_4_))) {
      *(long *)(in_FS_OFFSET + -0x1f0) = *(long *)(in_FS_OFFSET + -0x1f0) + 1;
      goto LAB_0044ff06;
    }
    auVar23 = vsqrtss_avx(auVar23,auVar23);
    auVar13._0_4_ = auVar23._0_4_;
    fVar41 = fVar41 / auVar13._0_4_;
    auVar13._4_4_ = auVar13._0_4_;
    auVar13._8_4_ = auVar13._0_4_;
    auVar13._12_4_ = auVar13._0_4_;
    auVar23 = vdivps_avx(auVar15,auVar13);
    auVar15 = vmovshdup_avx(auVar23);
    auVar15 = vfmadd213ss_fma(auVar15,auVar24,ZEXT416((uint)fVar41));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ + (fVar41 - fVar41))),auVar23,auVar24);
    auVar32 = auVar23;
    if (auVar15._0_4_ < 0.0) {
      auVar32._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar23._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar23._12_4_ ^ 0x80000000;
    }
    uVar2 = vcmpss_avx512f(auVar15,auVar24,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    _local_78 = vmovshdup_avx(auVar32);
    fVar30 = local_78._0_4_;
    fVar41 = (float)((uint)bVar3 * (int)-fVar41 + (uint)!bVar3 * (int)fVar41);
    local_98 = ZEXT416((uint)fVar41);
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * local_b8.y)),auVar32,ZEXT416((uint)local_b8.x)
                             );
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * local_a8.y)),auVar32,ZEXT416((uint)local_a8.x)
                             );
    auVar23 = vfmadd231ss_fma(auVar23,local_98,ZEXT416((uint)local_b8.z));
    auVar24 = vfmadd231ss_fma(auVar24,local_98,ZEXT416((uint)local_a8.z));
    if (0.0 < auVar23._0_4_ * auVar24._0_4_) goto LAB_0044ff06;
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar24,auVar17);
    auVar17 = SUB6416(ZEXT464(0x3f800000),0);
    auVar15 = vminss_avx(auVar17,auVar24);
    fVar21 = 0.0;
    uVar2 = vcmpss_avx512f(auVar17,auVar24,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar12._4_12_ = auVar13._4_12_;
    bVar6 = auVar24._0_4_ < -1.0;
    fVar11 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar15._0_4_);
    bVar7 = 0.0 < fVar11;
    auVar12._0_4_ =
         (uint)bVar7 * (int)fVar11 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar13._0_4_));
    fVar11 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    auVar13 = ZEXT416((uint)fVar11);
    auVar15 = vfnmadd213ss_fma(auVar12,auVar12,auVar17);
    auVar15 = vmaxss_avx(auVar15,ZEXT816(0) << 0x40);
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    auVar37._0_4_ = auVar15._0_4_ / fVar11;
    auVar37._4_12_ = auVar15._4_12_;
    fVar11 = 1.0;
    if (auVar37._0_4_ < 1.0) {
      auVar15 = vfnmadd213ss_fma(auVar37,auVar37,ZEXT416(0x3f800000));
      auVar15 = vmaxss_avx(auVar15,ZEXT816(0) << 0x20);
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      auVar37 = vfmsub213ss_fma(auVar12,auVar13,auVar15);
      auVar17 = vfmadd213ss_fma(auVar12,auVar13,auVar15);
      auVar38._0_4_ = auVar37._0_4_ / auVar17._0_4_;
      auVar38._4_12_ = auVar37._4_12_;
      auVar17 = vfnmadd213ss_fma(auVar15,auVar13,auVar12);
      auVar15 = vfmadd213ss_fma(auVar15,auVar13,auVar12);
      fVar11 = auVar17._0_4_ / auVar15._0_4_;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar38,auVar38);
      fVar11 = auVar15._0_4_ * 0.5;
    }
    auVar23 = vfmadd213ss_fma(auVar23,ZEXT416((uint)fVar10),auVar24);
    local_58._0_4_ = auVar23._0_4_;
    local_38._0_4_ =
         (float)((uint)(mode == Radiance) * (int)((1.0 / fVar10) * (1.0 / fVar10)) +
                (uint)(mode != Radiance) * 0x3f800000) * (1.0 - fVar11);
    fVar41 = fVar41 * fVar41;
    auVar23 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar41)),ZEXT816(0) << 0x40);
    fVar10 = auVar23._0_4_ / fVar41;
    if ((ABS(fVar10) != INFINITY) && (1e-16 <= fVar41 * fVar41)) {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar11 = 0.0;
      fVar21 = auVar23._0_4_;
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        auVar24._0_4_ = auVar32._0_4_ / fVar21;
        auVar24._4_12_ = auVar32._4_12_;
        auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
        uVar2 = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar27 = this_00->alpha_x;
        fVar11 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar23._0_4_);
        fVar29 = (fVar11 * fVar11) / (fVar27 * fVar27);
        auVar36._0_4_ = fVar30 / fVar21;
        auVar36._4_12_ = local_78._4_12_;
        auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar36);
        uVar2 = vcmpss_avx512f(auVar36,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar11 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar23._0_4_);
        fVar11 = fVar11 * fVar11;
      }
      else {
        fVar27 = this_00->alpha_x;
        fVar29 = 1.0 / (fVar27 * fVar27);
      }
      fVar30 = (this->mfDistrib).alpha_y;
      fVar10 = fVar10 * (fVar29 + fVar11 / (fVar30 * fVar30)) + 1.0;
      fVar21 = 1.0 / (fVar41 * fVar41 * fVar27 * 3.1415927 * fVar30 * fVar10 * fVar10);
    }
    local_48._0_4_ = fVar21;
    _local_88 = auVar32;
    local_5c = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_a8);
    FVar16 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_b8);
    auVar25._8_4_ = 0x7fffffff;
    auVar25._0_8_ = 0x7fffffff7fffffff;
    auVar25._12_4_ = 0x7fffffff;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._0_4_ * local_b8.y)),_local_88,
                              ZEXT416((uint)local_b8.x));
    auVar23 = vfmadd231ss_fma(auVar23,local_98,ZEXT416((uint)local_b8.z));
    auVar23 = vandps_avx(auVar23,auVar25);
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._0_4_ * local_a8.y)),_local_88,
                              ZEXT416((uint)local_a8.x));
    auVar24 = vfmadd231ss_fma(auVar24,local_98,ZEXT416((uint)local_a8.z));
    auVar24 = vandps_avx(auVar24,auVar25);
    auVar18._0_4_ =
         ((1.0 / (local_5c + 1.0 + FVar16)) * (float)local_48._0_4_ * auVar23._0_4_ * auVar24._0_4_)
         / ((float)local_58._0_4_ * (float)local_58._0_4_ * fVar28);
    auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar23 = vandps_avx(auVar18,auVar25);
    local_88._4_4_ = auVar23._0_4_ * (float)local_38._0_4_;
  }
  else {
    if (((auVar20._0_4_ == 0.0) && (!NAN(auVar20._0_4_))) ||
       ((local_b8.z == 0.0 && (!NAN(local_b8.z))))) goto LAB_0044ff06;
    local_78._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78._4_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.y;
    fStack_70 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
    fStack_6c = wo._12_4_;
    auVar22._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.x + (float)local_78._0_4_;
    auVar22._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y + (float)local_78._4_4_;
    auVar22._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z + fStack_70;
    auVar22._12_4_ = wi._12_4_ + fStack_6c;
    fVar28 = auVar20._0_4_ + local_b8.z;
    auVar24 = vmovshdup_avx(auVar22);
    fVar30 = auVar24._0_4_;
    if (((((auVar22._0_4_ == 0.0) && (!NAN(auVar22._0_4_))) && (fVar30 == 0.0)) &&
        ((!NAN(fVar30) && (fVar28 == 0.0)))) && (!NAN(fVar28))) goto LAB_0044ff06;
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * fVar30)),auVar22,auVar22);
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar30 = auVar24._0_4_;
    auVar31._4_4_ = fVar30;
    auVar31._0_4_ = fVar30;
    auVar31._8_4_ = fVar30;
    auVar31._12_4_ = fVar30;
    fVar28 = fVar28 / fVar30;
    auVar24 = vdivps_avx(auVar22,auVar31);
    auVar32 = ZEXT416(0) << 0x20;
    auVar15 = vmovshdup_avx(auVar24);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * 0.0)),auVar24,auVar32);
    fVar30 = fVar28 + auVar15._0_4_;
    auVar40 = auVar24;
    if (fVar30 < 0.0) {
      auVar40._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar24._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar24._12_4_ ^ 0x80000000;
    }
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar30),auVar32,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    _local_88 = vandps_avx(auVar23,auVar34);
    auVar39._0_4_ = auVar40._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar39._4_4_ = auVar40._4_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar39._8_4_ = auVar40._8_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar39._12_4_ = auVar40._12_4_ * wi._12_4_;
    auVar23 = vmovshdup_avx(auVar39);
    auVar23 = vfmadd231ss_fma(auVar23,auVar40,_local_38);
    auVar15 = vfmadd231ss_fma(auVar23,local_98,
                              ZEXT416((uint)bVar3 * (int)-fVar28 + (uint)!bVar3 * (int)fVar28));
    _local_78 = vandps_avx(local_98,auVar34);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar15,auVar4);
    auVar17 = SUB6416(ZEXT464(0x3f800000),0);
    auVar23 = vminss_avx(auVar17,auVar15);
    uVar2 = vcmpss_avx512f(auVar17,auVar15,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar30 = 1.0;
    auVar14._4_12_ = auVar13._4_12_;
    bVar6 = auVar15._0_4_ < -1.0;
    fVar11 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar23._0_4_);
    bVar7 = 0.0 < fVar11;
    auVar14._0_4_ =
         (uint)bVar7 * (int)fVar11 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar13._0_4_));
    fVar11 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    auVar15 = ZEXT416((uint)fVar11);
    auVar23 = vfnmadd213ss_fma(auVar14,auVar14,auVar17);
    auVar23 = vmaxss_avx(auVar23,auVar32);
    auVar23 = vsqrtss_avx(auVar23,auVar23);
    auVar33._0_4_ = auVar23._0_4_ / fVar11;
    auVar33._4_12_ = auVar23._4_12_;
    if (auVar33._0_4_ < 1.0) {
      auVar23 = vfnmadd213ss_fma(auVar33,auVar33,ZEXT416(0x3f800000));
      auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x20);
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      auVar13 = vfmsub213ss_fma(auVar14,auVar15,auVar23);
      auVar32 = vfmadd213ss_fma(auVar14,auVar15,auVar23);
      auVar42._0_4_ = auVar13._0_4_ / auVar32._0_4_;
      auVar42._4_12_ = auVar13._4_12_;
      auVar32 = vfnmadd213ss_fma(auVar23,auVar15,auVar14);
      auVar23 = vfmadd213ss_fma(auVar23,auVar15,auVar14);
      fVar30 = auVar32._0_4_ / auVar23._0_4_;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * fVar30)),auVar42,auVar42);
      fVar30 = auVar23._0_4_ * 0.5;
    }
    fVar28 = fVar28 * fVar28;
    fVar11 = 0.0;
    local_98._0_4_ = fVar30;
    auVar23 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar28)),ZEXT816(0) << 0x20);
    fVar30 = auVar23._0_4_ / fVar28;
    if ((ABS(fVar30) != INFINITY) && (1e-16 <= fVar28 * fVar28)) {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar11 = 0.0;
      fVar21 = auVar23._0_4_;
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        auVar35._4_4_ = fVar21;
        auVar35._0_4_ = fVar21;
        auVar35._8_4_ = fVar21;
        auVar35._12_4_ = fVar21;
        auVar23 = vdivps_avx(auVar24,auVar35);
        auVar5._8_4_ = 0x3f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar5._12_4_ = 0x3f800000;
        uVar1 = vcmpps_avx512vl(auVar23,auVar5,0xe);
        uVar2 = vcmpss_avx512f(auVar23,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        auVar24 = vmovshdup_avx(auVar23);
        bVar8 = (byte)(uVar1 >> 1);
        fVar21 = (float)((uint)bVar3 * -0x40800000 +
                        (uint)!bVar3 *
                        ((uint)((byte)uVar1 & 1) * 0x3f800000 +
                        (uint)!(bool)((byte)uVar1 & 1) * auVar23._0_4_));
        uVar2 = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar11 = (float)((uint)bVar3 * -0x40800000 +
                        (uint)!bVar3 *
                        ((uint)(bVar8 & 1) * 0x3f800000 + (uint)!(bool)(bVar8 & 1) * auVar24._0_4_))
        ;
        fVar21 = (fVar21 * fVar21) / (fVar41 * fVar41);
        fVar11 = fVar11 * fVar11;
      }
      else {
        fVar21 = 1.0 / (fVar41 * fVar41);
      }
      fVar30 = fVar30 * (fVar21 + fVar11 / (fVar10 * fVar10)) + 1.0;
      fVar11 = 1.0 / (fVar10 * fVar41 * 3.1415927 * fVar28 * fVar28 * fVar30 * fVar30);
    }
    local_58._0_4_ = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_a8);
    FVar16 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_b8);
    local_88._4_4_ =
         ((1.0 / ((float)local_58._0_4_ + 1.0 + FVar16)) * fVar11 * (float)local_98._0_4_) /
         ((float)local_78._0_4_ * 4.0 * (float)local_88._0_4_);
  }
  local_88._0_4_ = local_88._4_4_;
  fStack_80 = (float)local_88._4_4_;
  fStack_7c = (float)local_88._4_4_;
LAB_0044ff06:
  auVar23 = vshufpd_avx(_local_88,_local_88,1);
  SVar43.values.values._0_8_ = local_88;
  SVar43.values.values._8_8_ = auVar23._0_8_;
  return (SampledSpectrum)SVar43.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (mfDistrib.EffectivelySpecular())
            return SampledSpectrum(0);
        if (SameHemisphere(wo, wi)) {
            // Compute reflection at non-delta dielectric interface
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            Vector3f wh = wi + wo;
            // Handle degenerate cases for microfacet reflection
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return SampledSpectrum(0.);
            if (wh.x == 0 && wh.y == 0 && wh.z == 0)
                return SampledSpectrum(0.);
            wh = Normalize(wh);
            Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
            return SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                   (4 * cosTheta_i * cosTheta_o));

        } else {
            // Compute transmission at non-delta dielectric interface
            Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wh = wo + wi * etap;
            CHECK_RARE(1e-6, LengthSquared(wh) == 0);
            if (LengthSquared(wh) == 0)
                return {};
            wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

            // both on same side?
            if (Dot(wi, wh) * Dot(wo, wh) > 0)
                return {};

            Float F = FrDielectric(Dot(wo, wh), eta);
            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
            return SampledSpectrum((1 - F) * factor *
                                   std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                            AbsDot(wi, wh) * AbsDot(wo, wh) /
                                            (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
        }
    }